

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult *
Catch::clara::detail::convertInto<double>
          (ParserResult *__return_storage_ptr__,string *source,double *target)

{
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  double local_1a0 [2];
  ostream local_190 [16];
  byte abStack_180 [360];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  ::std::operator<<(local_190,(string *)source);
  ::std::istream::_M_extract<double>(local_1a0);
  if ((abStack_180[*(long *)((long)local_1a0[0] + -0x18)] & 5) == 0) {
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_0017f638;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    ::std::operator+(&local_1e0,"Unable to convert \'",source);
    ::std::operator+(&local_1c0,&local_1e0,"\' to destination type");
    BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
              (__return_storage_ptr__,&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline auto convertInto( std::string const &source, T& target ) -> ParserResult {
        std::stringstream ss;
        ss << source;
        ss >> target;
        if( ss.fail() )
            return ParserResult::runtimeError( "Unable to convert '" + source + "' to destination type" );
        else
            return ParserResult::ok( ParseResultType::Matched );
    }